

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::
ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (ParserRefImpl<Catch::clara::detail::Arg> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref,string *hint)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  string *hint_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ref_local;
  ParserRefImpl<Catch::clara::detail::Arg> *this_local;
  
  local_30.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = hint;
  hint_local = (string *)ref;
  ref_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this;
  ComposableParserImpl<Catch::clara::detail::Arg>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::clara::detail::Arg>);
  (this->super_ComposableParserImpl<Catch::clara::detail::Arg>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00259928;
  this->m_optionality = Optional;
  ::std::
  make_shared<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (&local_30);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            (&this->m_ref,
             (shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_30);
  std::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_30);
  ::std::__cxx11::string::string
            ((string *)&this->m_hint,
             local_30.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}